

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O2

void __thiscall
FFlatVertexBuffer::UpdatePlaneVertices(FFlatVertexBuffer *this,sector_t *sec,int plane)

{
  double *pdVar1;
  FFlatVertex *pFVar2;
  FFlatVertex *pFVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  float fVar8;
  
  lVar4 = 0xd8;
  if (plane == 0) {
    lVar4 = 0xb0;
  }
  pFVar2 = this->map;
  pFVar3 = (this->vbo_shadowdata).Array;
  iVar5 = 0;
  if (0 < sec->vbocount[plane]) {
    iVar5 = sec->vbocount[plane];
  }
  lVar6 = (long)sec->vboindex[plane] * 0x14;
  while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
    pdVar1 = (double *)((long)&sec->planes[0].xform.xOffs + lVar4);
    fVar8 = (float)((pdVar1[1] * (double)*(float *)((long)&pFVar3->y + lVar6) +
                    *(double *)((long)&sec->planes[0].xform.xScale + lVar4) +
                    *pdVar1 * (double)*(float *)((long)&pFVar3->x + lVar6)) *
                   *(double *)((long)&sec->planes[0].xform.yScale + lVar4));
    *(float *)((long)&pFVar3->z + lVar6) = fVar8;
    if ((plane == 0) && (sec->transdoor == true)) {
      fVar8 = fVar8 + -1.0;
      *(float *)((long)&pFVar3->z + lVar6) = fVar8;
    }
    *(float *)((long)&pFVar2->z + lVar6) = fVar8;
    lVar6 = lVar6 + 0x14;
  }
  return;
}

Assistant:

void FFlatVertexBuffer::UpdatePlaneVertices(sector_t *sec, int plane)
{
	int startvt = sec->vboindex[plane];
	int countvt = sec->vbocount[plane];
	secplane_t &splane = sec->GetSecPlane(plane);
	FFlatVertex *vt = &vbo_shadowdata[startvt];
	FFlatVertex *mapvt = &map[startvt];
	for(int i=0; i<countvt; i++, vt++, mapvt++)
	{
		vt->z = splane.ZatPoint(vt->x, vt->y);
		if (plane == sector_t::floor && sec->transdoor) vt->z -= 1;
		mapvt->z = vt->z;
	}
}